

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O0

void convolve_2d_sr_ver_2tap_half_avx2
               (int16_t *im_block,int32_t w,int32_t h,InterpFilterParams *filter_params_y,
               int32_t subpel_y_q4,uint8_t *dst,int32_t dst_stride)

{
  __m256i src;
  __m256i src_00;
  __m256i src_01;
  __m256i res_00;
  __m256i res1;
  ptrdiff_t in_RCX;
  int in_EDX;
  int in_ESI;
  ulong *puVar1;
  __m128i *s_64_00;
  uint *in_RDI;
  uint *puVar2;
  long in_R9;
  ulong uVar3;
  undefined8 uVar4;
  __m128i alVar5;
  __m128i src_02;
  __m128i res_01;
  __m128i src_03;
  int in_stack_00000008;
  __m256i s_256_2 [2] [4];
  __m256i s_256_1 [2] [2];
  __m256i r_3 [2];
  __m256i s_256 [2];
  __m256i r_2;
  __m256i res_2;
  __m128i s_128 [2];
  __m128i r_1;
  __m128i res_1;
  __m128i s_64 [2];
  __m128i r;
  __m128i res;
  __m128i s_32 [2];
  int32_t y;
  int16_t *im;
  undefined8 local_620;
  ptrdiff_t in_stack_fffffffffffff9e8;
  __m256i *in_stack_fffffffffffff9f0;
  __m256i *in_stack_fffffffffffff9f8;
  int16_t *in_stack_fffffffffffffa00;
  __m128i *in_stack_fffffffffffffa18;
  int16_t *in_stack_fffffffffffffa20;
  uint8_t *in_stack_fffffffffffffa28;
  uint8_t *dst_00;
  __m256i *in_stack_fffffffffffffa30;
  __m256i *s1;
  __m256i *in_stack_fffffffffffffa38;
  __m256i *s0;
  int16_t *in_stack_fffffffffffffa40;
  int16_t *src_04;
  undefined1 in_stack_fffffffffffffa48 [16];
  __m256i in_stack_fffffffffffffa58;
  longlong local_1a0 [4];
  ulong local_180;
  undefined8 uStack_178;
  ulong local_170;
  undefined8 uStack_168;
  ulong local_160 [5];
  int local_134;
  uint *local_130;
  long local_128;
  undefined1 local_100 [16];
  uint local_e4;
  uint *local_d8;
  uint *local_d0;
  uint *local_c8;
  uint *local_b8;
  longlong local_a0;
  undefined8 uStack_98;
  undefined1 *local_88;
  undefined8 local_80;
  uint *local_70;
  uint *local_68;
  uint *local_60;
  uint *local_58;
  uint *local_50;
  uint *local_48;
  uint *local_40;
  
  local_88 = (undefined1 *)&local_620;
  local_134 = in_EDX;
  local_130 = in_RDI;
  local_128 = in_R9;
  if (in_ESI == 2) {
    local_e4 = *in_RDI;
    local_100._4_4_ = 0;
    local_100._0_4_ = local_e4;
    local_100._8_8_ = 0;
    local_160[0] = local_100._0_8_;
    local_160[1] = 0;
    uVar3 = local_100._0_8_;
    uVar4 = local_100._8_8_;
    local_100 = ZEXT416(local_e4);
    do {
      puVar1 = local_160;
      puVar2 = local_130;
      xy_y_convolve_2tap_2x2_half_pel_sse2
                (in_stack_fffffffffffffa00,(__m128i *)in_stack_fffffffffffff9f8);
      src_02[1] = (longlong)puVar1;
      src_02[0] = (longlong)puVar2;
      local_170 = uVar3;
      uStack_168 = uVar4;
      alVar5 = xy_y_round_half_pel_sse2(src_02);
      res_01[1] = (long)in_stack_00000008;
      res_01[0] = local_128;
      local_180 = uVar3;
      uStack_178 = uVar4;
      pack_store_2x2_sse2(res_01,alVar5[1],in_RCX);
      local_130 = local_130 + 2;
      in_RCX = (ptrdiff_t)(in_stack_00000008 << 1);
      local_128 = local_128 + in_RCX;
      local_134 = local_134 + -2;
    } while (local_134 != 0);
  }
  else if (in_ESI == 4) {
    local_1a0[0] = *(longlong *)in_RDI;
    uStack_98 = 0;
    local_1a0[1] = 0;
    local_a0 = local_1a0[0];
    do {
      s_64_00 = (__m128i *)local_1a0;
      puVar2 = local_130;
      xy_y_convolve_2tap_4x2_half_pel_sse2((int16_t *)local_130,s_64_00);
      src_03[1] = (longlong)s_64_00;
      src_03[0] = (longlong)puVar2;
      xy_y_round_half_pel_sse2(src_03);
      alVar5[1] = (longlong)in_stack_fffffffffffffa00;
      alVar5[0] = (longlong)in_stack_fffffffffffff9f8;
      pack_store_4x2_sse2(alVar5,(uint8_t *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
      local_130 = local_130 + 4;
      local_128 = local_128 + (in_stack_00000008 << 1);
      local_134 = local_134 + -2;
    } while (local_134 != 0);
  }
  else if (in_ESI == 8) {
    do {
      xy_y_convolve_2tap_8x2_half_pel_avx2(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
      src[1] = (longlong)in_stack_fffffffffffffa20;
      src[0] = (longlong)in_stack_fffffffffffffa18;
      src[2] = (longlong)in_stack_fffffffffffffa28;
      src[3] = (longlong)in_stack_fffffffffffffa30;
      xy_y_round_half_pel_avx2(src);
      res_00[1] = (longlong)in_stack_fffffffffffffa40;
      res_00[0] = (longlong)in_stack_fffffffffffffa38;
      res_00[2] = in_stack_fffffffffffffa48._0_8_;
      res_00[3] = in_stack_fffffffffffffa48._8_8_;
      pack_store_8x2_avx2(res_00,(uint8_t *)in_stack_fffffffffffffa30,
                          (ptrdiff_t)in_stack_fffffffffffffa28);
      local_130 = local_130 + 8;
      local_128 = local_128 + (in_stack_00000008 << 1);
      local_134 = local_134 + -2;
    } while (local_134 != 0);
  }
  else if (in_ESI == 0x10) {
    do {
      xy_y_convolve_2tap_16x2_half_pel_avx2
                (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
      src_00[1] = (longlong)in_stack_fffffffffffffa20;
      src_00[0] = (longlong)in_stack_fffffffffffffa18;
      src_00[2] = (longlong)in_stack_fffffffffffffa28;
      src_00[3] = (longlong)in_stack_fffffffffffffa30;
      xy_y_round_half_pel_avx2(src_00);
      src_01[1] = (longlong)in_stack_fffffffffffffa20;
      src_01[0] = (longlong)in_stack_fffffffffffffa18;
      src_01[2] = (longlong)in_stack_fffffffffffffa28;
      src_01[3] = (longlong)in_stack_fffffffffffffa30;
      xy_y_round_half_pel_avx2(src_01);
      res1[1] = (longlong)in_stack_fffffffffffffa40;
      res1[0] = (longlong)in_stack_fffffffffffffa38;
      res1[2] = in_stack_fffffffffffffa48._0_8_;
      res1[3] = in_stack_fffffffffffffa48._8_8_;
      xy_y_pack_store_16x2_avx2
                (in_stack_fffffffffffffa58,res1,(uint8_t *)in_stack_fffffffffffffa30,
                 (ptrdiff_t)in_stack_fffffffffffffa28);
      local_130 = local_130 + 0x10;
      local_128 = local_128 + (in_stack_00000008 << 1);
      local_134 = local_134 + -2;
    } while (local_134 != 0);
  }
  else if (in_ESI == 0x20) {
    local_b8 = in_RDI + 8;
    do {
      xy_y_convolve_2tap_half_pel_32_all_avx2
                (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                 in_stack_fffffffffffffa28);
      xy_y_convolve_2tap_half_pel_32_all_avx2
                (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                 in_stack_fffffffffffffa28);
      local_130 = local_130 + 0x20;
      local_128 = local_128 + (in_stack_00000008 << 1);
      local_134 = local_134 + -2;
    } while (local_134 != 0);
  }
  else if (in_ESI == 0x40) {
    local_c8 = in_RDI + 8;
    local_d0 = in_RDI + 0x10;
    local_d8 = in_RDI + 0x18;
    do {
      xy_y_convolve_2tap_half_pel_32_all_avx2
                (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                 in_stack_fffffffffffffa28);
      xy_y_convolve_2tap_half_pel_32_all_avx2
                (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                 in_stack_fffffffffffffa28);
      local_130 = local_130 + 0x40;
      xy_y_convolve_2tap_half_pel_32_all_avx2
                (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                 in_stack_fffffffffffffa28);
      xy_y_convolve_2tap_half_pel_32_all_avx2
                (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                 in_stack_fffffffffffffa28);
      local_128 = local_128 + (in_stack_00000008 << 1);
      local_134 = local_134 + -2;
    } while (local_134 != 0);
  }
  else {
    local_80 = 0x10;
    local_620 = *(undefined8 *)in_RDI;
    local_40 = in_RDI + 8;
    local_48 = in_RDI + 0x10;
    dst_00 = *(uint8_t **)(in_RDI + 0x12);
    s1 = *(__m256i **)(in_RDI + 0x14);
    s0 = *(__m256i **)(in_RDI + 0x16);
    local_50 = in_RDI + 0x18;
    src_04 = *(int16_t **)local_50;
    local_58 = in_RDI + 0x20;
    local_60 = in_RDI + 0x28;
    local_68 = in_RDI + 0x30;
    local_70 = in_RDI + 0x38;
    do {
      xy_y_convolve_2tap_half_pel_32_all_avx2(src_04,s0,s1,dst_00);
      xy_y_convolve_2tap_half_pel_32_all_avx2(src_04,s0,s1,dst_00);
      xy_y_convolve_2tap_half_pel_32_all_avx2(src_04,s0,s1,dst_00);
      xy_y_convolve_2tap_half_pel_32_all_avx2(src_04,s0,s1,dst_00);
      local_130 = local_130 + 0x80;
      xy_y_convolve_2tap_half_pel_32_all_avx2(src_04,s0,s1,dst_00);
      xy_y_convolve_2tap_half_pel_32_all_avx2(src_04,s0,s1,dst_00);
      xy_y_convolve_2tap_half_pel_32_all_avx2(src_04,s0,s1,dst_00);
      xy_y_convolve_2tap_half_pel_32_all_avx2(src_04,s0,s1,dst_00);
      local_128 = local_128 + (in_stack_00000008 << 1);
      local_134 = local_134 + -2;
    } while (local_134 != 0);
  }
  return;
}

Assistant:

static void convolve_2d_sr_ver_2tap_half_avx2(
    const int16_t *const im_block, const int32_t w, const int32_t h,
    const InterpFilterParams *const filter_params_y, const int32_t subpel_y_q4,
    uint8_t *dst, const int32_t dst_stride) {
  const int16_t *im = im_block;
  int32_t y = h;

  (void)filter_params_y;
  (void)subpel_y_q4;

  if (w == 2) {
    __m128i s_32[2];

    s_32[0] = _mm_cvtsi32_si128(*(int32_t *)im);

    do {
      const __m128i res = xy_y_convolve_2tap_2x2_half_pel_sse2(im, s_32);
      const __m128i r = xy_y_round_half_pel_sse2(res);
      pack_store_2x2_sse2(r, dst, dst_stride);
      im += 2 * 2;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else if (w == 4) {
    __m128i s_64[2];

    s_64[0] = _mm_loadl_epi64((__m128i *)im);

    do {
      const __m128i res = xy_y_convolve_2tap_4x2_half_pel_sse2(im, s_64);
      const __m128i r = xy_y_round_half_pel_sse2(res);
      pack_store_4x2_sse2(r, dst, dst_stride);
      im += 2 * 4;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else if (w == 8) {
    __m128i s_128[2];

    s_128[0] = _mm_loadu_si128((__m128i *)im);

    do {
      const __m256i res = xy_y_convolve_2tap_8x2_half_pel_avx2(im, s_128);
      const __m256i r = xy_y_round_half_pel_avx2(res);
      pack_store_8x2_avx2(r, dst, dst_stride);
      im += 2 * 8;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else if (w == 16) {
    __m256i s_256[2], r[2];

    s_256[0] = _mm256_loadu_si256((__m256i *)im);

    do {
      xy_y_convolve_2tap_16x2_half_pel_avx2(im, s_256, r);
      r[0] = xy_y_round_half_pel_avx2(r[0]);
      r[1] = xy_y_round_half_pel_avx2(r[1]);
      xy_y_pack_store_16x2_avx2(r[0], r[1], dst, dst_stride);
      im += 2 * 16;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else if (w == 32) {
    __m256i s_256[2][2];

    s_256[0][0] = _mm256_loadu_si256((__m256i *)(im + 0 * 16));
    s_256[0][1] = _mm256_loadu_si256((__m256i *)(im + 1 * 16));

    do {
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 32, s_256[0], s_256[1], dst);
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 2 * 32, s_256[1], s_256[0],
                                              dst + dst_stride);
      im += 2 * 32;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else if (w == 64) {
    __m256i s_256[2][4];

    s_256[0][0] = _mm256_loadu_si256((__m256i *)(im + 0 * 16));
    s_256[0][1] = _mm256_loadu_si256((__m256i *)(im + 1 * 16));
    s_256[0][2] = _mm256_loadu_si256((__m256i *)(im + 2 * 16));
    s_256[0][3] = _mm256_loadu_si256((__m256i *)(im + 3 * 16));

    do {
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 64, s_256[0] + 0,
                                              s_256[1] + 0, dst);
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 96, s_256[0] + 2,
                                              s_256[1] + 2, dst + 32);
      im += 2 * 64;
      xy_y_convolve_2tap_half_pel_32_all_avx2(im, s_256[1] + 0, s_256[0] + 0,
                                              dst + dst_stride);
      xy_y_convolve_2tap_half_pel_32_all_avx2(
          im + 32, s_256[1] + 2, s_256[0] + 2, dst + dst_stride + 32);
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else {
    __m256i s_256[2][8];

    assert(w == 128);

    load_16bit_8rows_avx2(im, 16, s_256[0]);

    do {
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 128, s_256[0] + 0,
                                              s_256[1] + 0, dst);
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 160, s_256[0] + 2,
                                              s_256[1] + 2, dst + 1 * 32);
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 192, s_256[0] + 4,
                                              s_256[1] + 4, dst + 2 * 32);
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 224, s_256[0] + 6,
                                              s_256[1] + 6, dst + 3 * 32);
      im += 2 * 128;
      xy_y_convolve_2tap_half_pel_32_all_avx2(im, s_256[1] + 0, s_256[0] + 0,
                                              dst + dst_stride);
      xy_y_convolve_2tap_half_pel_32_all_avx2(
          im + 32, s_256[1] + 2, s_256[0] + 2, dst + dst_stride + 1 * 32);
      xy_y_convolve_2tap_half_pel_32_all_avx2(
          im + 64, s_256[1] + 4, s_256[0] + 4, dst + dst_stride + 2 * 32);
      xy_y_convolve_2tap_half_pel_32_all_avx2(
          im + 96, s_256[1] + 6, s_256[0] + 6, dst + dst_stride + 3 * 32);
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  }
}